

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

natwm_error event_subscribe_to_root(natwm_state *state)

{
  undefined4 uVar1;
  natwm_error nVar2;
  void *__ptr;
  xcb_event_mask_t root_mask;
  
  uVar1 = xcb_change_window_attributes_checked(state->xcb,state->screen->root,0x800);
  __ptr = (void *)xcb_request_check(state->xcb,uVar1);
  xcb_flush(state->xcb);
  if (__ptr == (void *)0x0) {
    nVar2 = NO_ERROR;
  }
  else {
    free(__ptr);
    nVar2 = RESOLUTION_FAILURE;
  }
  return nVar2;
}

Assistant:

enum natwm_error event_subscribe_to_root(const struct natwm_state *state)
{
        xcb_event_mask_t root_mask
                = XCB_EVENT_MASK_SUBSTRUCTURE_NOTIFY | XCB_EVENT_MASK_SUBSTRUCTURE_REDIRECT;
        xcb_void_cookie_t cookie = xcb_change_window_attributes_checked(
                state->xcb, state->screen->root, XCB_CW_EVENT_MASK, &root_mask);
        xcb_generic_error_t *error = xcb_request_check(state->xcb, cookie);

        xcb_flush(state->xcb);

        if (error != XCB_NONE) {
                // We will fail if there is already a window manager present
                free(error);

                return RESOLUTION_FAILURE;
        }

        return NO_ERROR;
}